

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

string * __thiscall
re2::ProgToString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,Prog *prog,Workq *q)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  Inst *this_00;
  uint *puVar4;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar3 = *(uint **)&prog->list_count_;
  for (puVar4 = puVar3; iVar1._0_1_ = prog->anchor_start_, iVar1._1_1_ = prog->anchor_end_,
      iVar1._2_1_ = prog->reversed_, iVar1._3_1_ = prog->did_flatten_, puVar4 != puVar3 + iVar1;
      puVar4 = puVar4 + 1) {
    uVar2 = *puVar4;
    this_00 = (Inst *)((long)(int)uVar2 * 8 + *(long *)(this + 0x60));
    Prog::Inst::Dump_abi_cxx11_(&local_70,this_00);
    StringPrintf_abi_cxx11_(&local_50,"%d. %s\n",(ulong)uVar2,local_70._M_dataplus._M_p);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    AddToQueue((Workq *)prog,this_00->out_opcode_ >> 4);
    if ((this_00->out_opcode_ & 6) == 0) {
      AddToQueue((Workq *)prog,(this_00->field_1).cap_);
    }
    puVar3 = *(uint **)&prog->list_count_;
  }
  return __return_storage_ptr__;
}

Assistant:

void Prog::Optimize() {
  Workq q(size_);

  // Eliminate nops.  Most are taken out during compilation
  // but a few are hard to avoid.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;

    Inst* ip = inst(id);
    int j = ip->out();
    Inst* jp;
    while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
      j = jp->out();
    }
    ip->set_out(j);
    AddToQueue(&q, ip->out());

    if (ip->opcode() == kInstAlt) {
      j = ip->out1();
      while (j != 0 && (jp=inst(j))->opcode() == kInstNop) {
        j = jp->out();
      }
      ip->out1_ = j;
      AddToQueue(&q, ip->out1());
    }
  }

  // Insert kInstAltMatch instructions
  // Look for
  //   ip: Alt -> j | k
  //	  j: ByteRange [00-FF] -> ip
  //    k: Match
  // or the reverse (the above is the greedy one).
  // Rewrite Alt to AltMatch.
  q.clear();
  AddToQueue(&q, start_);
  for (Workq::iterator i = q.begin(); i != q.end(); ++i) {
    int id = *i;
    Inst* ip = inst(id);
    AddToQueue(&q, ip->out());
    if (ip->opcode() == kInstAlt)
      AddToQueue(&q, ip->out1());

    if (ip->opcode() == kInstAlt) {
      Inst* j = inst(ip->out());
      Inst* k = inst(ip->out1());
      if (j->opcode() == kInstByteRange && j->out() == id &&
          j->lo() == 0x00 && j->hi() == 0xFF &&
          IsMatch(this, k)) {
        ip->set_opcode(kInstAltMatch);
        continue;
      }
      if (IsMatch(this, j) &&
          k->opcode() == kInstByteRange && k->out() == id &&
          k->lo() == 0x00 && k->hi() == 0xFF) {
        ip->set_opcode(kInstAltMatch);
      }
    }
  }
}